

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XGLLoader.cpp
# Opt level: O2

void __thiscall Assimp::XGLImporter::ReadFaceVertex(XGLImporter *this,TempMesh *t,TempFace *out)

{
  undefined8 uVar1;
  bool bVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  aiVector2D aVar5;
  aiVector3D aVar6;
  uint id;
  allocator<char> local_c9;
  uint local_c8;
  uint local_c4;
  _Base_ptr local_c0;
  map<unsigned_int,_aiVector2t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
  *local_b8;
  aiVector3D *local_b0;
  _Base_ptr local_a8;
  map<unsigned_int,_aiVector3t<float>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
  *local_a0;
  _Base_ptr local_98;
  string local_90;
  string local_70;
  string local_50;
  
  GetElementName_abi_cxx11_(&local_50,this);
  local_b0 = &out->normal;
  local_b8 = &t->uvs;
  local_c0 = &(t->uvs)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a0 = &t->normals;
  local_a8 = &(t->normals)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_98 = &(t->points)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c4 = 0;
  while( true ) {
    bVar2 = ReadElementUpToClosing(this,local_50._M_dataplus._M_p);
    if (!bVar2) break;
    GetElementName_abi_cxx11_(&local_70,this);
    bVar2 = std::operator==(&local_70,"pref");
    if (bVar2) {
      local_c8 = ReadIndexFromText(this);
      cVar3 = std::
              _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiVector3t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiVector3t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
              ::find((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiVector3t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiVector3t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                      *)t,&local_c8);
      if (cVar3._M_node == local_98) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"point index out of range",&local_c9);
        LogFunctions<Assimp::XGLImporter>::ThrowException(&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      (out->pos).z = *(float *)((long)&cVar3._M_node[1]._M_parent + 4);
      uVar1 = *(undefined8 *)&cVar3._M_node[1].field_0x4;
      (out->pos).x = (float)(int)uVar1;
      (out->pos).y = (float)(int)((ulong)uVar1 >> 0x20);
      local_c4 = (uint)CONCAT71((int7)((ulong)uVar1 >> 8),1);
    }
    else {
      bVar2 = std::operator==(&local_70,"nref");
      if (bVar2) {
        local_c8 = ReadIndexFromText(this);
        cVar3 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiVector3t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiVector3t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector3t<float>_>_>_>
                ::find(&local_a0->_M_t,&local_c8);
        if (cVar3._M_node == local_a8) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_90,"normal index out of range",&local_c9);
          LogFunctions<Assimp::XGLImporter>::ThrowException(&local_90);
          std::__cxx11::string::~string((string *)&local_90);
        }
        local_b0->z = *(float *)((long)&cVar3._M_node[1]._M_parent + 4);
        uVar1 = *(undefined8 *)&cVar3._M_node[1].field_0x4;
        local_b0->x = (float)(int)uVar1;
        local_b0->y = (float)(int)((ulong)uVar1 >> 0x20);
        out->has_normal = true;
      }
      else {
        bVar2 = std::operator==(&local_70,"tcref");
        if (bVar2) {
          local_c8 = ReadIndexFromText(this);
          cVar4 = std::
                  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_aiVector2t<float>_>,_std::_Select1st<std::pair<const_unsigned_int,_aiVector2t<float>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_aiVector2t<float>_>_>_>
                  ::find(&local_b8->_M_t,&local_c8);
          if (cVar4._M_node == local_c0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_90,"uv index out of range",&local_c9);
            LogFunctions<Assimp::XGLImporter>::ThrowException(&local_90);
            std::__cxx11::string::~string((string *)&local_90);
          }
          out->uv = *(aiVector2D *)&cVar4._M_node[1].field_0x4;
          out->has_uv = true;
        }
        else {
          bVar2 = std::operator==(&local_70,"p");
          if (bVar2) {
            aVar6 = ReadVec3(this);
            out->pos = aVar6;
          }
          else {
            bVar2 = std::operator==(&local_70,"n");
            if (bVar2) {
              aVar6 = ReadVec3(this);
              out->normal = aVar6;
            }
            else {
              bVar2 = std::operator==(&local_70,"tc");
              if (bVar2) {
                aVar5 = ReadVec2(this);
                out->uv = aVar5;
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((local_c4 & 1) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"missing <pref> in <fvN> element",(allocator<char> *)&local_90);
    LogFunctions<Assimp::XGLImporter>::ThrowException(&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void XGLImporter::ReadFaceVertex(const TempMesh& t, TempFace& out)
{
    const std::string& end = GetElementName();

    bool havep = false;
    while (ReadElementUpToClosing(end.c_str()))  {
        const std::string& s = GetElementName();
        if (s == "pref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector3D>::const_iterator it = t.points.find(id);
            if (it == t.points.end()) {
                ThrowException("point index out of range");
            }

            out.pos = (*it).second;
            havep = true;
        }
        else if (s == "nref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector3D>::const_iterator it = t.normals.find(id);
            if (it == t.normals.end()) {
                ThrowException("normal index out of range");
            }

            out.normal = (*it).second;
            out.has_normal = true;
        }
        else if (s == "tcref") {
            const unsigned int id = ReadIndexFromText();
            std::map<unsigned int, aiVector2D>::const_iterator it = t.uvs.find(id);
            if (it == t.uvs.end()) {
                ThrowException("uv index out of range");
            }

            out.uv = (*it).second;
            out.has_uv = true;
        }
        else if (s == "p") {
            out.pos = ReadVec3();
        }
        else if (s == "n") {
            out.normal = ReadVec3();
        }
        else if (s == "tc") {
            out.uv = ReadVec2();
        }
    }

    if (!havep) {
        ThrowException("missing <pref> in <fvN> element");
    }
}